

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu1.c
# Opt level: O0

MPP_RET vdpu1_mpg4d_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  HalTaskInfo *local_50;
  DecCbHalDone param;
  RK_U32 i;
  RK_U32 reg_count;
  M4vdVdpu1Regs_t *regs;
  hal_mpg4_ctx *ctx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x48);
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x20),0x10,(void *)0x0);
  if (MVar2 != MPP_OK) {
    _mpp_log_l(2,"hal_m4vd_vdpu1","poll cmd failed %d\n","vdpu1_mpg4d_wait",(ulong)(uint)MVar2);
  }
  if ((hal_mpg4d_debug & 2) != 0) {
    param._20_4_ = 0x65;
    for (param.hard_err = 0; param.hard_err < (uint)param._20_4_;
        param.hard_err = param.hard_err + 1) {
      _mpp_log_l(4,"hal_m4vd_vdpu1","reg[%03d]: %08x\n",(char *)0x0,(ulong)param.hard_err,
                 (ulong)*(uint *)(lVar1 + (ulong)param.hard_err * 4));
    }
  }
  if (*(long *)((long)hal + 0x18) != 0) {
    param.task = *(void **)((long)hal + 0x48);
    param.regs._0_4_ = (uint)(((*(uint *)(lVar1 + 4) >> 0xc & 1) != 0 ^ 0xffU) & 1);
    local_50 = task;
    mpp_callback_f("vdpu1_mpg4d_wait",*(MppCbCtx **)((long)hal + 0x18),&local_50);
  }
  memset((void *)(lVar1 + 4),0,4);
  return MVar2;
}

Assistant:

MPP_RET vdpu1_mpg4d_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    hal_mpg4_ctx *ctx = (hal_mpg4_ctx *)hal;
    M4vdVdpu1Regs_t *regs = (M4vdVdpu1Regs_t *)ctx->regs;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (hal_mpg4d_debug & MPG4D_HAL_DBG_REG_GET) {
        RK_U32 reg_count = (sizeof(M4vdVdpu1Regs_t) / sizeof(RK_U32));
        RK_U32 i = 0;

        for (i = 0; i < reg_count; i++) {
            mpp_log("reg[%03d]: %08x\n", i, ((RK_U32 *)regs)[i]);
        }
    }
    if (ctx->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)ctx->regs;
        param.hard_err = !regs->SwReg01.sw_dec_rdy_int;

        mpp_callback(ctx->dec_cb, &param);
    }

    memset(&regs->SwReg01, 0, sizeof(RK_U32));

    (void)task;
    return ret;
}